

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O2

int fct_clp__add_options(fct_clp_t *clp,fctcl_init_t *options)

{
  fctcl_store_t fVar1;
  fctcl_t *clo;
  char *pcVar2;
  char **ppcVar3;
  
  ppcVar3 = &options->help;
  do {
    fVar1 = *(fctcl_store_t *)(ppcVar3 + -1);
    if (fVar1 == FCTCL_STORE_UNDEFINED) {
      return 1;
    }
    clo = (fctcl_t *)calloc(1,0x28);
    if (clo == (fctcl_t *)0x0) {
      return 0;
    }
    clo->action = fVar1;
    if (*ppcVar3 != (char *)0x0) {
      pcVar2 = fctstr_clone(*ppcVar3);
      clo->help = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_00104274;
    }
    if (((fctcl_init_t *)(ppcVar3 + -3))->long_opt != (char *)0x0) {
      pcVar2 = fctstr_clone(((fctcl_init_t *)(ppcVar3 + -3))->long_opt);
      clo->long_opt = pcVar2;
      if (pcVar2 == (char *)0x0) goto LAB_00104274;
    }
    if (ppcVar3[-2] != (char *)0x0) {
      pcVar2 = fctstr_clone(ppcVar3[-2]);
      clo->short_opt = pcVar2;
      if (pcVar2 == (char *)0x0) {
LAB_00104274:
        fctcl__del(clo);
        return 0;
      }
    }
    fct_nlist__append(&clp->clo_list,clo);
    ppcVar3 = ppcVar3 + 4;
  } while( true );
}

Assistant:

static int
fct_clp__add_options(fct_clp_t *clp, fctcl_init_t const *options)
{
    fctcl_init_t const *pclo =NULL;
    int ok;
    for ( pclo = options; pclo->action != FCTCL_STORE_UNDEFINED; ++pclo )
    {
        fctcl_t *cpy = fctcl_new2(pclo);
        if ( cpy == NULL )
        {
            ok = 0;
            goto finally;
        }
        fct_nlist__append(&(clp->clo_list), (void*)cpy);
    }
    ok =1;
finally:
    return ok;
}